

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpluginloader.cpp
# Opt level: O0

QList<QStaticPlugin> * QPluginLoader::staticPlugins(void)

{
  Type *pTVar1;
  QList<QStaticPlugin> *in_RDI;
  StaticPluginList *plugins;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_staticPluginList>_>
  *in_stack_ffffffffffffffd8;
  QList<QStaticPlugin> *this;
  
  this = in_RDI;
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_staticPluginList>_>::
           operator()(in_stack_ffffffffffffffd8);
  if (pTVar1 == (Type *)0x0) {
    memset(this,0,0x18);
    QList<QStaticPlugin>::QList((QList<QStaticPlugin> *)0x45cf8f);
  }
  else {
    QList<QStaticPlugin>::QList(this,(QList<QStaticPlugin> *)in_stack_ffffffffffffffd8);
  }
  return in_RDI;
}

Assistant:

QList<QStaticPlugin> QPluginLoader::staticPlugins()
{
    StaticPluginList *plugins = staticPluginList();
    if (plugins)
        return *plugins;
    return QList<QStaticPlugin>();
}